

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O1

void __thiscall vw::predict(vw *this,example *ec)

{
  single_learner *psVar1;
  vw_exception *this_00;
  stringstream __msg;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  if (this->l[0xe8] != (learner<char,_char>)0x1) {
    psVar1 = LEARNER::as_singleline<char,char>(this->l);
    (**(code **)(psVar1 + 0x30))
              (*(undefined8 *)(psVar1 + 0x18),*(undefined8 *)(psVar1 + 0x20),ec,
               *(code **)(psVar1 + 0x30));
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_190,"This reduction does not support single-line examples.",0x35);
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/global_data.cc"
             ,0xa6,&local_1c0);
  __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void vw::predict(example& ec)
{
  if (l->is_multiline)
    THROW("This reduction does not support single-line examples.");

  LEARNER::as_singleline(l)->predict(ec);
}